

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O0

void Diligent::PipelineStateUtils::
     ExtractShaders<Diligent::SerializedShaderImpl,std::vector<Diligent::SerializedShaderStageInfo,std::allocator<Diligent::SerializedShaderStageInfo>>>
               (RayTracingPipelineStateCreateInfo *CreateInfo,
               vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
               *ShaderStages,bool WaitUntilShadersReady,SHADER_TYPE *ActiveShaderStages)

{
  bool bVar1;
  Int32 IVar2;
  Char *pCVar3;
  reference this;
  size_t sVar4;
  pointer this_00;
  undefined1 local_100 [8];
  string msg_1;
  __normal_iterator<Diligent::SerializedShaderStageInfo_*,_std::vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>_>
  local_d0;
  __normal_iterator<Diligent::SerializedShaderStageInfo_*,_std::vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>_>
  local_c8;
  iterator iter;
  uint local_b8;
  Uint32 i_2;
  Uint32 i_1;
  Uint32 i;
  anon_class_32_4_a6542874 AddShader;
  unordered_set<Diligent::IShader_*,_std::hash<Diligent::IShader_*>,_std::equal_to<Diligent::IShader_*>,_std::allocator<Diligent::IShader_*>_>
  UniqueShaders;
  undefined1 local_48 [8];
  string msg;
  SHADER_TYPE *ActiveShaderStages_local;
  bool WaitUntilShadersReady_local;
  vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
  *ShaderStages_local;
  RayTracingPipelineStateCreateInfo *CreateInfo_local;
  
  msg.field_2._8_8_ = ActiveShaderStages;
  bVar1 = PipelineStateDesc::IsRayTracingPipeline((PipelineStateDesc *)CreateInfo);
  if (!bVar1) {
    FormatString<char[26],char[42]>
              ((string *)local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CreateInfo.PSODesc.IsRayTracingPipeline()",
               (char (*) [42])ActiveShaderStages);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x118);
    std::__cxx11::string::~string((string *)local_48);
  }
  std::
  unordered_set<Diligent::IShader_*,_std::hash<Diligent::IShader_*>,_std::equal_to<Diligent::IShader_*>,_std::allocator<Diligent::IShader_*>_>
  ::unordered_set((unordered_set<Diligent::IShader_*,_std::hash<Diligent::IShader_*>,_std::equal_to<Diligent::IShader_*>,_std::allocator<Diligent::IShader_*>_>
                   *)&AddShader.WaitUntilShadersReady);
  AddShader.UniqueShaders =
       (unordered_set<Diligent::IShader_*,_std::hash<Diligent::IShader_*>,_std::equal_to<Diligent::IShader_*>,_std::allocator<Diligent::IShader_*>_>
        *)msg.field_2._8_8_;
  _i_1 = ShaderStages;
  AddShader.ShaderStages =
       (vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
        *)&AddShader.WaitUntilShadersReady;
  AddShader.ActiveShaderStages._0_1_ = WaitUntilShadersReady;
  std::
  vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
  ::clear(ShaderStages);
  std::
  vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
  ::resize(ShaderStages,6);
  *(undefined4 *)msg.field_2._8_8_ = 0;
  for (i_2 = 0; i_2 < CreateInfo->GeneralShaderCount; i_2 = i_2 + 1) {
    ExtractShaders<Diligent::SerializedShaderImpl,_std::vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>_>
    ::anon_class_32_4_a6542874::operator()
              ((anon_class_32_4_a6542874 *)&i_1,CreateInfo->pGeneralShaders[i_2].pShader);
  }
  for (local_b8 = 0; local_b8 < CreateInfo->TriangleHitShaderCount; local_b8 = local_b8 + 1) {
    ExtractShaders<Diligent::SerializedShaderImpl,_std::vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>_>
    ::anon_class_32_4_a6542874::operator()
              ((anon_class_32_4_a6542874 *)&i_1,
               CreateInfo->pTriangleHitShaders[local_b8].pClosestHitShader);
    ExtractShaders<Diligent::SerializedShaderImpl,_std::vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>_>
    ::anon_class_32_4_a6542874::operator()
              ((anon_class_32_4_a6542874 *)&i_1,
               CreateInfo->pTriangleHitShaders[local_b8].pAnyHitShader);
  }
  for (iter._M_current._4_4_ = 0; iter._M_current._4_4_ < CreateInfo->ProceduralHitShaderCount;
      iter._M_current._4_4_ = iter._M_current._4_4_ + 1) {
    ExtractShaders<Diligent::SerializedShaderImpl,_std::vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>_>
    ::anon_class_32_4_a6542874::operator()
              ((anon_class_32_4_a6542874 *)&i_1,
               CreateInfo->pProceduralHitShaders[iter._M_current._4_4_].pIntersectionShader);
    ExtractShaders<Diligent::SerializedShaderImpl,_std::vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>_>
    ::anon_class_32_4_a6542874::operator()
              ((anon_class_32_4_a6542874 *)&i_1,
               CreateInfo->pProceduralHitShaders[iter._M_current._4_4_].pClosestHitShader);
    ExtractShaders<Diligent::SerializedShaderImpl,_std::vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>_>
    ::anon_class_32_4_a6542874::operator()
              ((anon_class_32_4_a6542874 *)&i_1,
               CreateInfo->pProceduralHitShaders[iter._M_current._4_4_].pAnyHitShader);
  }
  IVar2 = GetShaderTypePipelineIndex(SHADER_TYPE_RAY_GEN,PIPELINE_TYPE_RAY_TRACING);
  this = std::
         vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
         ::operator[](ShaderStages,(long)IVar2);
  sVar4 = SerializedShaderStageInfo::Count(this);
  if (sVar4 == 0) {
    CreateInfo = (RayTracingPipelineStateCreateInfo *)0x142;
    LogError<true,char[68]>
              (false,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x142,(char (*) [68])
                      "At least one shader with type SHADER_TYPE_RAY_GEN must be provided.");
  }
  local_c8._M_current =
       (SerializedShaderStageInfo *)
       std::
       vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
       ::begin(ShaderStages);
  while( true ) {
    local_d0._M_current =
         (SerializedShaderStageInfo *)
         std::
         vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
         ::end(ShaderStages);
    bVar1 = __gnu_cxx::operator!=(&local_c8,&local_d0);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<Diligent::SerializedShaderStageInfo_*,_std::vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>_>
              ::operator->(&local_c8);
    sVar4 = SerializedShaderStageInfo::Count(this_00);
    if (sVar4 == 0) {
      __gnu_cxx::
      __normal_iterator<Diligent::SerializedShaderStageInfo_const*,std::vector<Diligent::SerializedShaderStageInfo,std::allocator<Diligent::SerializedShaderStageInfo>>>
      ::__normal_iterator<Diligent::SerializedShaderStageInfo*>
                ((__normal_iterator<Diligent::SerializedShaderStageInfo_const*,std::vector<Diligent::SerializedShaderStageInfo,std::allocator<Diligent::SerializedShaderStageInfo>>>
                  *)(msg_1.field_2._M_local_buf + 8),&local_c8);
      local_c8._M_current =
           (SerializedShaderStageInfo *)
           std::
           vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
           ::erase(ShaderStages,(const_iterator)msg_1.field_2._8_8_);
    }
    else {
      __gnu_cxx::
      __normal_iterator<Diligent::SerializedShaderStageInfo_*,_std::vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>_>
      ::operator++(&local_c8);
    }
  }
  bVar1 = std::
          vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
          ::empty(ShaderStages);
  if (bVar1) {
    FormatString<char[26],char[22]>
              ((string *)local_100,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"!ShaderStages.empty()",(char (*) [22])CreateInfo);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x151);
    std::__cxx11::string::~string((string *)local_100);
  }
  std::
  unordered_set<Diligent::IShader_*,_std::hash<Diligent::IShader_*>,_std::equal_to<Diligent::IShader_*>,_std::allocator<Diligent::IShader_*>_>
  ::~unordered_set((unordered_set<Diligent::IShader_*,_std::hash<Diligent::IShader_*>,_std::equal_to<Diligent::IShader_*>,_std::allocator<Diligent::IShader_*>_>
                    *)&AddShader.WaitUntilShadersReady);
  return;
}

Assistant:

void ExtractShaders(const RayTracingPipelineStateCreateInfo& CreateInfo,
                    TShaderStages&                           ShaderStages,
                    bool                                     WaitUntilShadersReady,
                    SHADER_TYPE&                             ActiveShaderStages)
{
    VERIFY_EXPR(CreateInfo.PSODesc.IsRayTracingPipeline());

    std::unordered_set<IShader*> UniqueShaders;

    auto AddShader = [&ShaderStages,
                      &UniqueShaders,
                      &ActiveShaderStages,
                      WaitUntilShadersReady](IShader* pShader) {
        if (pShader != nullptr && UniqueShaders.insert(pShader).second)
        {
            const SHADER_TYPE ShaderType = pShader->GetDesc().ShaderType;
            const Int32       StageInd   = GetShaderTypePipelineIndex(ShaderType, PIPELINE_TYPE_RAY_TRACING);
            auto&             Stage      = ShaderStages[StageInd];
            ActiveShaderStages |= ShaderType;
            RefCntAutoPtr<ShaderImplType> pShaderImpl{pShader, ShaderImplType::IID_InternalImpl};
            VERIFY(pShaderImpl, "Unexpected shader object implementation");
            WaitUntilShaderReadyIfRequested(pShaderImpl, WaitUntilShadersReady);
            Stage.Append(pShaderImpl);
        }
    };

    ShaderStages.clear();
    ShaderStages.resize(MAX_SHADERS_IN_PIPELINE);
    ActiveShaderStages = SHADER_TYPE_UNKNOWN;

    for (Uint32 i = 0; i < CreateInfo.GeneralShaderCount; ++i)
    {
        AddShader(CreateInfo.pGeneralShaders[i].pShader);
    }
    for (Uint32 i = 0; i < CreateInfo.TriangleHitShaderCount; ++i)
    {
        AddShader(CreateInfo.pTriangleHitShaders[i].pClosestHitShader);
        AddShader(CreateInfo.pTriangleHitShaders[i].pAnyHitShader);
    }
    for (Uint32 i = 0; i < CreateInfo.ProceduralHitShaderCount; ++i)
    {
        AddShader(CreateInfo.pProceduralHitShaders[i].pIntersectionShader);
        AddShader(CreateInfo.pProceduralHitShaders[i].pClosestHitShader);
        AddShader(CreateInfo.pProceduralHitShaders[i].pAnyHitShader);
    }

    if (ShaderStages[GetShaderTypePipelineIndex(SHADER_TYPE_RAY_GEN, PIPELINE_TYPE_RAY_TRACING)].Count() == 0)
        LOG_ERROR_AND_THROW("At least one shader with type SHADER_TYPE_RAY_GEN must be provided.");

    // Remove empty stages
    for (auto iter = ShaderStages.begin(); iter != ShaderStages.end();)
    {
        if (iter->Count() == 0)
        {
            iter = ShaderStages.erase(iter);
        }
        else
        {
            ++iter;
        }
    }

    VERIFY_EXPR(!ShaderStages.empty());
}